

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O1

void __thiscall
llm_graph_input_attn_cross::set_input(llm_graph_input_attn_cross *this,llama_ubatch *ubatch)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  void *pvVar4;
  llama_cross *plVar5;
  pointer psVar6;
  _Base_ptr p_Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  char cVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  long lVar17;
  _Base_ptr p_Var18;
  _Rb_tree_header *p_Var19;
  _Rb_tree_header *p_Var20;
  int iVar22;
  undefined1 auVar21 [16];
  undefined4 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  long lVar25;
  
  if (this->cross_kq_mask == (ggml_tensor *)0x0) {
    return;
  }
  lVar3 = this->cross_kq_mask->ne[0];
  uVar1 = ubatch->n_tokens;
  cVar11 = ggml_backend_buffer_is_host();
  if (cVar11 == '\0') {
    pcVar13 = "ggml_backend_buffer_is_host(cross_kq_mask->buffer)";
    uVar16 = 0x209;
  }
  else {
    if (ubatch->equal_seqs != true) {
      lVar12 = (long)(int)uVar1;
      pvVar4 = this->cross_kq_mask->data;
      if (uVar1 != 0) {
        uVar14 = 0;
        do {
          if (0 < lVar3) {
            uVar2 = ubatch->n_seq_id[uVar14];
            plVar5 = this->cross;
            lVar17 = 0;
            do {
              uVar23 = 0xff800000;
              if (0 < (int)uVar2) {
                psVar6 = (plVar5->seq_ids_enc).
                         super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                p_Var20 = &psVar6[lVar17]._M_t._M_impl.super__Rb_tree_header;
                uVar15 = 0;
                uVar23 = 0xff800000;
                do {
                  iVar22 = ubatch->seq_id[uVar14][uVar15];
                  p_Var18 = &p_Var20->_M_header;
                  for (p_Var7 = *(_Base_ptr *)
                                 ((long)&psVar6[lVar17]._M_t._M_impl.super__Rb_tree_header + 8);
                      (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
                      p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < iVar22]) {
                    if (iVar22 <= (int)*(size_t *)(p_Var7 + 1)) {
                      p_Var18 = p_Var7;
                    }
                  }
                  p_Var19 = p_Var20;
                  if (((_Rb_tree_header *)p_Var18 != p_Var20) &&
                     (p_Var19 = (_Rb_tree_header *)p_Var18,
                     iVar22 < (int)((_Rb_tree_header *)p_Var18)->_M_node_count)) {
                    p_Var19 = p_Var20;
                  }
                  if (p_Var19 != p_Var20) {
                    uVar23 = 0;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar15 != uVar2);
              }
              *(undefined4 *)((long)pvVar4 + lVar17 * 4 + uVar14 * lVar3 * 4) = uVar23;
              lVar17 = lVar17 + 1;
            } while (lVar17 != lVar3);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar1);
      }
      auVar10 = _DAT_002360d0;
      auVar9 = _DAT_002360c0;
      auVar8 = _DAT_002360b0;
      uVar14 = (ulong)uVar1 + 0x3f & 0xffffffffffffffc0;
      if ((long)uVar14 <= lVar12) {
        return;
      }
      lVar17 = lVar3 + -1;
      auVar21._8_4_ = (int)lVar17;
      auVar21._0_8_ = lVar17;
      auVar21._12_4_ = (int)((ulong)lVar17 >> 0x20);
      lVar17 = (long)pvVar4 + lVar3 * lVar12 * 4 + 0xc;
      auVar21 = auVar21 ^ _DAT_002360d0;
      do {
        if (0 < lVar3) {
          uVar15 = 0;
          auVar24 = auVar9;
          auVar26 = auVar8;
          do {
            auVar27 = auVar24 ^ auVar10;
            iVar22 = auVar21._4_4_;
            if ((bool)(~(auVar27._4_4_ == iVar22 && auVar21._0_4_ < auVar27._0_4_ ||
                        iVar22 < auVar27._4_4_) & 1)) {
              *(undefined4 *)(lVar17 + -0xc + uVar15 * 4) = 0xff800000;
            }
            if ((auVar27._12_4_ != auVar21._12_4_ || auVar27._8_4_ <= auVar21._8_4_) &&
                auVar27._12_4_ <= auVar21._12_4_) {
              *(undefined4 *)(lVar17 + -8 + uVar15 * 4) = 0xff800000;
            }
            auVar27 = auVar26 ^ auVar10;
            iVar28 = auVar27._4_4_;
            if (iVar28 <= iVar22 && (iVar28 != iVar22 || auVar27._0_4_ <= auVar21._0_4_)) {
              *(undefined4 *)(lVar17 + -4 + uVar15 * 4) = 0xff800000;
              *(undefined4 *)(lVar17 + uVar15 * 4) = 0xff800000;
            }
            uVar15 = uVar15 + 4;
            lVar25 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 4;
            auVar24._8_8_ = lVar25 + 4;
            lVar25 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 4;
            auVar26._8_8_ = lVar25 + 4;
          } while ((lVar3 + 3U & 0xfffffffffffffffc) != uVar15);
        }
        lVar12 = lVar12 + 1;
        lVar17 = lVar17 + lVar3 * 4;
      } while (lVar12 < (long)uVar14);
      return;
    }
    pcVar13 = "!ubatch->equal_seqs";
    uVar16 = 0x20a;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
             ,uVar16,"GGML_ASSERT(%s) failed",pcVar13);
}

Assistant:

void llm_graph_input_attn_cross::set_input(const llama_ubatch * ubatch) {
    if (cross_kq_mask) {
        const int64_t n_enc    = cross_kq_mask->ne[0];
        const int64_t n_tokens = ubatch->n_tokens;

        GGML_ASSERT(ggml_backend_buffer_is_host(cross_kq_mask->buffer));
        GGML_ASSERT(!ubatch->equal_seqs); // TODO: use ubatch->n_seqs instead of failing

        float * data = (float *) cross_kq_mask->data;

        for (int h = 0; h < 1; ++h) {
            for (int j = 0; j < n_tokens; ++j) {
                for (int i = 0; i < n_enc; ++i) {
                    float f = -INFINITY;
                    for (int s = 0; s < ubatch->n_seq_id[j]; ++s) {
                        const llama_seq_id seq_id = ubatch->seq_id[j][s];
                        if (cross->seq_ids_enc[i].find(seq_id) != cross->seq_ids_enc[i].end()) {
                            f = 0.0f;
                        }
                    }
                    data[h*(n_enc*n_tokens) + j*n_enc + i] = f;
                }
            }

            for (int i = n_tokens; i < GGML_PAD(n_tokens, GGML_KQ_MASK_PAD); ++i) {
                for (int j = 0; j < n_enc; ++j) {
                    data[h*(n_enc*n_tokens) + i*n_enc + j] = -INFINITY;
                }
            }
        }
    }
}